

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void yy_accept(yyParser *yypParser)

{
  Parse *pPVar1;
  Parse *pParse;
  yyParser *yypParser_local;
  
  pPVar1 = yypParser->pParse;
  while (-1 < yypParser->yyidx) {
    yy_pop_parser_stack(yypParser);
  }
  yypParser->pParse = pPVar1;
  return;
}

Assistant:

static void yy_accept(
  yyParser *yypParser           /* The parser */
){
  sqlite3ParserARG_FETCH;
#ifndef NDEBUG
  if( yyTraceFILE ){
    fprintf(yyTraceFILE,"%sAccept!\n",yyTracePrompt);
  }
#endif
  while( yypParser->yyidx>=0 ) yy_pop_parser_stack(yypParser);
  /* Here code is inserted which will be executed whenever the
  ** parser accepts */
  sqlite3ParserARG_STORE; /* Suppress warning about unused %extra_argument variable */
}